

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::task_pool::task_pool(task_pool *this)

{
  char *in_RDI;
  char *maximumCount;
  char *pName;
  long in_stack_ffffffffffffffe8;
  tsstack<crnlib::task_pool::task,_16U> *in_stack_fffffffffffffff0;
  
  pName = in_RDI;
  tsstack<crnlib::task_pool::task,_16U>::tsstack(in_stack_fffffffffffffff0);
  pName[0x210] = '\0';
  pName[0x211] = '\0';
  pName[0x212] = '\0';
  pName[0x213] = '\0';
  maximumCount = pName + 0x298;
  semaphore::semaphore
            ((semaphore *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(long)maximumCount,
             pName);
  semaphore::semaphore
            ((semaphore *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(long)maximumCount,
             pName);
  in_RDI[0x2a8] = '\0';
  in_RDI[0x2a9] = '\0';
  in_RDI[0x2aa] = '\0';
  in_RDI[0x2ab] = '\0';
  in_RDI[0x2ac] = '\0';
  in_RDI[0x2ad] = '\0';
  in_RDI[0x2ae] = '\0';
  in_RDI[0x2af] = '\0';
  in_RDI[0x2b0] = '\0';
  in_RDI[0x2b1] = '\0';
  in_RDI[0x2b2] = '\0';
  in_RDI[0x2b3] = '\0';
  in_RDI[0x2b4] = '\0';
  in_RDI[0x2b5] = '\0';
  in_RDI[0x2b6] = '\0';
  in_RDI[0x2b7] = '\0';
  in_RDI[0x2b8] = '\0';
  in_RDI[0x2b9] = '\0';
  in_RDI[0x2ba] = '\0';
  in_RDI[699] = '\0';
  in_RDI[700] = '\0';
  in_RDI[0x2bd] = '\0';
  in_RDI[0x2be] = '\0';
  in_RDI[0x2bf] = '\0';
  utils::zero_object<unsigned_long[16]>((unsigned_long (*) [16])0x1c5c33);
  return;
}

Assistant:

task_pool::task_pool()
    : m_num_threads(0),
      m_tasks_available(0, 32767),
      m_all_tasks_completed(0, 1),
      m_total_submitted_tasks(0),
      m_total_completed_tasks(0),
      m_exit_flag(false) {
  utils::zero_object(m_threads);
}